

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::Verify(SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
         *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *pRVar4;
  undefined8 *in_FS_OFFSET;
  
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::Verify
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
            );
  if (this->partialHeapBlockList !=
      (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
    if (pRVar4->inPartialCollectMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2f2,
                         "(this->partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "this->partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar3) goto LAB_002bd2b7;
      *puVar1 = 0;
    }
  }
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->partialHeapBlockList);
  if (this->partialSweptHeapBlockList !=
      (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
    if (pRVar4->inPartialCollectMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2f9,
                         "(this->partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "this->partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar3) {
LAB_002bd2b7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
  }
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->partialSweptHeapBlockList);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::Verify()
{
    __super::Verify();
    Assert(this->partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    HeapBlockList::ForEach(this->partialHeapBlockList, [](TBlockType * heapBlock)
    {
        Assert(heapBlock->HasFreeObject());
        heapBlock->Verify();
    });
#if ENABLE_CONCURRENT_GC
    Assert(this->partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    HeapBlockList::ForEach(this->partialSweptHeapBlockList, [](TBlockType * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
}